

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

bool __thiscall Jupiter::Socket::setSendTimeout(Socket *this,unsigned_long milliseconds)

{
  int iVar1;
  ulong local_28;
  timeval time;
  unsigned_long milliseconds_local;
  Socket *this_local;
  
  local_28 = milliseconds / 1000;
  time.tv_sec = (milliseconds % 1000) * 1000;
  time.tv_usec = milliseconds;
  iVar1 = setsockopt(this->m_data->rawSock,1,0x15,&local_28,0x10);
  return iVar1 == 0;
}

Assistant:

bool Jupiter::Socket::setSendTimeout(unsigned long milliseconds) {
#if defined _WIN32
	return setsockopt(m_data->rawSock, SOL_SOCKET, SO_SNDTIMEO, reinterpret_cast<const char *>(&milliseconds), sizeof(milliseconds)) == 0;
#else // _WIN32
	timeval time;
	time.tv_sec = milliseconds / 1000;
	time.tv_usec = (milliseconds % 1000) * 1000;
	return setsockopt(m_data->rawSock, SOL_SOCKET, SO_SNDTIMEO, (const void *) &time, sizeof(time)) == 0;
#endif // _WIN32
}